

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetDimTextOrientation(ON_DimStyle *this,TextOrientation orientation)

{
  if (this->m_dim_text_orientation != orientation) {
    this->m_dim_text_orientation = orientation;
    Internal_TextPositionPropertiesChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DimTextOrientation);
  return;
}

Assistant:

void ON_DimStyle::SetDimTextOrientation(ON::TextOrientation orientation)
{
  if (m_dim_text_orientation != orientation)
  {
    m_dim_text_orientation = orientation;
    Internal_TextPositionPropertiesChange();
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DimTextOrientation);
}